

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O0

char * borg_get_parsed_pain(char *pain,_Bool do_plural)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uStack_48;
  char cur;
  size_t i;
  size_t pos;
  size_t maxlen;
  int state;
  char *buf;
  size_t buflen;
  _Bool do_plural_local;
  char *pain_local;
  
  sVar2 = strlen(pain);
  pcVar3 = (char *)mem_zalloc(sVar2 + 1);
  maxlen._4_4_ = 0;
  sVar4 = strlen(pain);
  i = 1;
  *pcVar3 = ' ';
  for (uStack_48 = 0; uStack_48 < sVar4 && i < sVar2; uStack_48 = uStack_48 + 1) {
    cVar1 = pain[uStack_48];
    if ((maxlen._4_4_ == 0) && (cVar1 == '[')) {
      maxlen._4_4_ = 1;
    }
    else if ((maxlen._4_4_ == 1) && (cVar1 == '|')) {
      maxlen._4_4_ = 2;
    }
    else if ((maxlen._4_4_ == 0) || (cVar1 != ']')) {
      if ((maxlen._4_4_ == 0) ||
         (((maxlen._4_4_ == 1 && (!do_plural)) || ((maxlen._4_4_ == 2 && (do_plural)))))) {
        pcVar3[i] = cVar1;
        i = i + 1;
      }
    }
    else {
      maxlen._4_4_ = 0;
    }
  }
  return pcVar3;
}

Assistant:

static char *borg_get_parsed_pain(const char *pain, bool do_plural)
{
    size_t buflen = strlen(pain) + 1;
    char  *buf    = mem_zalloc(buflen);

    int    state  = MSG_PARSE_NORMAL;
    size_t maxlen = strlen(pain);
    size_t pos    = 1;

    /* for the borg, always start with a space */
    buf[0] = ' ';

    /* Put the message characters in the buffer */
    /* XXX This logic should be used everywhere for pluralising strings */
    for (size_t i = 0; i < maxlen && pos < buflen - 1; i++) {
        char cur = pain[i];

        /*
         * The characters '[|]' switch parsing mode and are never output.
         * The syntax is [singular|plural]
         */
        if (state == MSG_PARSE_NORMAL && cur == '[') {
            state = MSG_PARSE_SINGLE;
        } else if (state == MSG_PARSE_SINGLE && cur == '|') {
            state = MSG_PARSE_PLURAL;
        } else if (state != MSG_PARSE_NORMAL && cur == ']') {
            state = MSG_PARSE_NORMAL;
        } else if (state == MSG_PARSE_NORMAL
                   || (state == MSG_PARSE_SINGLE && do_plural == false)
                   || (state == MSG_PARSE_PLURAL && do_plural == true)) {
            /* Copy the characters according to the mode */
            buf[pos++] = cur;
        }
    }
    return buf;
}